

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
format_uint<3u,wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,uint value,int num_digits,
          bool upper)

{
  type tVar1;
  wchar_t *buffer_00;
  char local_43 [8];
  char buffer [11];
  wchar_t *ptr;
  bool upper_local;
  int num_digits_local;
  uint value_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  buffer._3_8_ = out.container;
  tVar1 = to_unsigned<int>(num_digits);
  buffer_00 = to_pointer<wchar_t>((buffer_appender<wchar_t>)buffer._3_8_,(ulong)tVar1);
  if (buffer_00 == (wchar_t *)0x0) {
    format_uint<3u,char,unsigned_int>(local_43,value,num_digits,upper);
    out_local = copy_str_noinline<wchar_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                          (local_43,local_43 + num_digits,out);
  }
  else {
    format_uint<3u,wchar_t,unsigned_int>(buffer_00,value,num_digits,upper);
    out_local.container = out.container;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_local.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}